

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_PerObjectMeshParameters *
ON_PerObjectMeshParameters::FindOrCreate(ON_Object *object,bool bCreate)

{
  ON_UserData *p;
  ON_PerObjectMeshParameters *this;
  ON_UUID local_38;
  ON_PerObjectMeshParameters *local_28;
  ON_PerObjectMeshParameters *ud;
  ON_Object *pOStack_18;
  bool bCreate_local;
  ON_Object *object_local;
  
  if (object == (ON_Object *)0x0) {
    object_local = (ON_Object *)0x0;
  }
  else {
    ud._7_1_ = bCreate;
    pOStack_18 = object;
    local_38 = ON_ClassId::Uuid(&m_ON_PerObjectMeshParameters_class_rtti);
    p = ON_Object::GetUserData(object,&local_38);
    local_28 = Cast(&p->super_ON_Object);
    if ((local_28 == (ON_PerObjectMeshParameters *)0x0) && ((ud._7_1_ & 1) != 0)) {
      this = (ON_PerObjectMeshParameters *)operator_new(0x1a8);
      ON_PerObjectMeshParameters(this);
      local_28 = this;
      ON_Object::AttachUserData(pOStack_18,(ON_UserData *)this);
    }
    object_local = (ON_Object *)local_28;
  }
  return (ON_PerObjectMeshParameters *)object_local;
}

Assistant:

ON_PerObjectMeshParameters* ON_PerObjectMeshParameters::FindOrCreate(const ON_Object* object,bool bCreate)
{
  if ( 0 == object )
    return 0;
  ON_PerObjectMeshParameters* ud = ON_PerObjectMeshParameters::Cast(object->GetUserData(ON_CLASS_ID(ON_PerObjectMeshParameters)));
  if ( !ud && bCreate )
  {
    ud = new ON_PerObjectMeshParameters();
    const_cast< ON_Object* >(object)->AttachUserData(ud);
  }
  return ud;
}